

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  iterator I;
  ArrayRef<llvm::StringRef> values_00;
  StringRef name_00;
  ConfigureContext *this_00;
  size_type __s1;
  int iVar1;
  size_t sVar2;
  BuildFileDelegate *pBVar3;
  undefined4 extraout_var;
  iterator From;
  iterator To;
  bool bVar4;
  bool local_251;
  StringRef local_1e8;
  char *local_1d8;
  StringRef arg;
  iterator __end2;
  iterator __begin2;
  ArrayRef<llvm::StringRef> *__range2;
  StringRef local_198;
  Twine local_188;
  Twine local_170;
  char *local_158;
  char *local_148;
  size_t local_140;
  ConfigureContext *local_138;
  ConfigureContext *ctx_local;
  ShellCommand *this_local;
  ArrayRef<llvm::StringRef> values_local;
  StringRef name_local;
  size_type local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char **local_78;
  char *local_70;
  size_t local_68;
  size_type *local_60;
  char *local_58;
  size_t local_50;
  size_t local_48;
  char *local_40;
  size_type local_38;
  int local_2c;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  values_local.Data = (StringRef *)values.Length;
  this_local = (ShellCommand *)values.Data;
  sVar2 = name.Length;
  local_148 = name.Data;
  local_158 = "args";
  local_140 = sVar2;
  local_138 = ctx;
  ctx_local = (ConfigureContext *)this;
  values_local.Length = (size_type)local_148;
  local_a0 = strlen("args");
  local_88 = local_148;
  local_80 = local_140;
  local_98 = local_158;
  local_a8 = local_158;
  local_70 = local_158;
  local_78 = &local_88;
  local_251 = false;
  local_90 = local_a0;
  local_68 = local_a0;
  if (local_140 == local_a0) {
    local_18 = local_148;
    local_20 = local_158;
    local_28 = local_a0;
    if (local_a0 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_148,local_158,local_a0);
    }
    local_251 = local_c == 0;
  }
  __s1 = values_local.Length;
  if (local_251) {
    bVar4 = llvm::ArrayRef<llvm::StringRef>::empty((ArrayRef<llvm::StringRef> *)&this_local);
    this_00 = local_138;
    if (bVar4) {
      local_198 = Command::getName((Command *)this);
      llvm::operator+(&local_188,"invalid arguments for command \'",&local_198);
      llvm::Twine::Twine((Twine *)&__range2,"\'");
      llvm::operator+(&local_170,&local_188,(Twine *)&__range2);
      ConfigureContext::error(this_00,&local_170);
      return false;
    }
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::clear(&this->args);
    sVar2 = llvm::ArrayRef<llvm::StringRef>::size((ArrayRef<llvm::StringRef> *)&this_local);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::reserve(&this->args,sVar2);
    __end2 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
    arg.Length = (size_t)llvm::ArrayRef<llvm::StringRef>::end
                                   ((ArrayRef<llvm::StringRef> *)&this_local);
    for (; __end2 != (iterator)arg.Length; __end2 = __end2 + 1) {
      local_1d8 = __end2->Data;
      arg.Data = (char *)__end2->Length;
      pBVar3 = ConfigureContext::getDelegate(local_138);
      iVar1 = (*pBVar3->_vptr_BuildFileDelegate[2])(pBVar3,local_1d8,arg.Data);
      local_1e8.Data = (char *)CONCAT44(extraout_var,iVar1);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (&this->args,&local_1e8);
    }
  }
  else {
    local_50 = strlen("deps");
    local_b8 = __s1;
    local_58 = "deps";
    local_60 = &local_b8;
    bVar4 = false;
    local_b0 = sVar2;
    if (sVar2 == local_50) {
      local_38 = __s1;
      local_40 = "deps";
      local_48 = local_50;
      if (local_50 == 0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp((void *)__s1,"deps",local_50);
      }
      bVar4 = local_2c == 0;
    }
    if (!bVar4) {
      name_00.Length = sVar2;
      name_00.Data = (char *)values_local.Length;
      values_00.Length = (size_type)values_local.Data;
      values_00.Data = (StringRef *)this_local;
      bVar4 = ExternalCommand::configureAttribute
                        (&this->super_ExternalCommand,local_138,name_00,values_00);
      return bVar4;
    }
    llvm::
    SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::clear(&(this->depsPaths).
             super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           );
    I = (iterator)
        (this->depsPaths).
        super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .
        super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        .super_SmallVectorBase.BeginX;
    From = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
    To = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
    llvm::SmallVectorImpl<std::__cxx11::string>::insert<llvm::StringRef_const*,void>
              ((SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths,I,From,To);
  }
  return true;
}

Assistant:

bool ShellCommand::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                              ArrayRef<StringRef> values) {
  if (name == "args") {
    // Diagnose missing arguments.
    if (values.empty()) {
      ctx.error("invalid arguments for command '" + getName() + "'");
      return false;
    }

    args.clear();
    args.reserve(values.size());
    for (auto arg: values) {
      args.emplace_back(ctx.getDelegate().getInternedString(arg));
    }
  } else if (name == "deps") {
    depsPaths.clear();
    depsPaths.insert(depsPaths.begin(), values.begin(), values.end());
  } else {
    return ExternalCommand::configureAttribute(ctx, name, values);
  }

  return true;
}